

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void apprun_concat_path(char *dest,char *path)

{
  size_t sVar1;
  int local_34;
  size_t sStack_30;
  int i;
  unsigned_long j;
  unsigned_long dest_len;
  unsigned_long path_len;
  char *path_local;
  char *dest_local;
  
  sVar1 = strlen(path);
  if (sVar1 != 0) {
    sStack_30 = strlen(dest);
    if ((sStack_30 != 0) && (dest[sStack_30 - 1] == '/')) {
      sStack_30 = sStack_30 - 1;
    }
    if (dest[sStack_30] == '\0') {
      dest[sStack_30] = '/';
    }
    for (local_34 = 0; (ulong)(long)local_34 <= sVar1; local_34 = local_34 + 1) {
      if ((dest[sStack_30] != '/') || (path[local_34] != '/')) {
        sStack_30 = sStack_30 + 1;
      }
      dest[sStack_30] = path[local_34];
    }
  }
  return;
}

Assistant:

void apprun_concat_path(char *dest, const char *path) {
    unsigned long path_len = strlen(path);
    if (path_len == 0)
        return;

    unsigned long dest_len = strlen(dest);
    unsigned long j = dest_len;

    if (j > 0 && dest[j - 1] == '/')
        j--;

    if (dest[j] == '\0')
        dest[j] = '/';

    // copy str avoiding repeated slashes
    for (int i = 0; i <= path_len; i++) {
        if (!(dest[j] == '/' && path[i] == '/'))
            j++;

        dest[j] = path[i];
    }
}